

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

void Wlc_NtkPrintCex(Wlc_Ntk_t *p,Wlc_Ntk_t *pAbs,Abc_Cex_t *pCex)

{
  int iVar1;
  uint uVar2;
  Wlc_Obj_t *p_00;
  int local_3c;
  int local_38;
  uint local_34;
  int nBits;
  int f;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Abc_Cex_t *pCex_local;
  Wlc_Ntk_t *pAbs_local;
  Wlc_Ntk_t *p_local;
  
  if (pCex == (Abc_Cex_t *)0x0) {
    local_3c = 0;
  }
  else {
    local_3c = pCex->nRegs;
  }
  local_38 = local_3c;
  if (pCex == (Abc_Cex_t *)0x0) {
    printf("The CEX is NULL.\n");
  }
  else {
    for (local_34 = 0; (int)local_34 <= pCex->iFrame; local_34 = local_34 + 1) {
      printf("Frame%02d ",(ulong)local_34);
      for (f = 0; iVar1 = Wlc_NtkPiNum(pAbs), f < iVar1; f = f + 1) {
        p_00 = Wlc_NtkPi(pAbs,f);
        printf("PI%d:",(ulong)(uint)f);
        for (nBits = 0; iVar1 = Wlc_ObjRange(p_00), nBits < iVar1; nBits = nBits + 1) {
          uVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_38);
          printf("%d",(ulong)uVar2);
          local_38 = local_38 + 1;
        }
        printf(" ");
      }
      printf("FF:");
      while (local_38 < pCex->nPis) {
        uVar2 = Abc_InfoHasBit((uint *)(pCex + 1),local_38);
        printf("%d",(ulong)uVar2);
        local_38 = local_38 + 1;
      }
      printf("\n");
    }
  }
  return;
}

Assistant:

void Wlc_NtkPrintCex( Wlc_Ntk_t * p, Wlc_Ntk_t * pAbs, Abc_Cex_t * pCex )
{
    Wlc_Obj_t * pObj; int i, k, f, nBits = pCex ? pCex->nRegs : 0;
    if ( pCex == NULL )
    {
        printf( "The CEX is NULL.\n" );
        return;
    }
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        printf( "Frame%02d ", f );
        Wlc_NtkForEachPi( pAbs, pObj, i )
        {
            printf( "PI%d:", i );
            //printf( "%d(%d):", nBits, Wlc_ObjRange(pObj) );
            for ( k = 0; k < Wlc_ObjRange(pObj); k++ )
                printf( "%d", Abc_InfoHasBit(pCex->pData,  nBits++) );
            printf( " " );
        }
        printf( "FF:" );
        for ( k = 0; nBits < pCex->nPis; k++ )
            printf( "%d", Abc_InfoHasBit(pCex->pData, nBits++) );
        printf( "\n" );
    }

}